

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void SQCompilation::StaticAnalyzer::reportGlobalNamesWarnings(HSQUIRRELVM vm)

{
  code *pcVar1;
  long lVar2;
  bool bVar3;
  vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_> *this;
  undefined8 uVar4;
  pointer ppVar5;
  size_type sVar6;
  const_reference pvVar7;
  undefined8 uVar8;
  long in_RDI;
  IdLocation *loc_1;
  int32_t i_1;
  vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_> *usages;
  bool isKnownBinding;
  string *id;
  iterator it_1;
  IdLocation *loc;
  int32_t i;
  vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_> *declarations;
  SQChar *name;
  iterator it;
  string message;
  SQCOMPILERERROR errorFunc;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffed8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>
  *in_stack_fffffffffffffee0;
  int local_bc;
  _Self local_b0;
  _Self local_a8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_a0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_98;
  undefined1 local_89;
  pointer local_88;
  _Self local_80;
  _Self local_78 [2];
  int local_54;
  _Self local_40;
  _Self local_38;
  string local_30;
  code *local_10;
  long local_8;
  
  local_10 = *(code **)(*(long *)(in_RDI + 0x128) + 0x160);
  if (local_10 != (code *)0x0) {
    local_8 = in_RDI;
    std::__cxx11::string::string((string *)&local_30);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
                  *)in_stack_fffffffffffffed8);
    while( true ) {
      local_40._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
                  *)in_stack_fffffffffffffed8);
      bVar3 = std::operator!=(&local_38,&local_40);
      if (!bVar3) break;
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>
                    *)0x1992dd);
      uVar8 = std::__cxx11::string::c_str();
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>
                             *)0x1992fa);
      this = &ppVar5->second;
      sVar6 = std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>::
              size(this);
      if (sVar6 != 1) {
        for (local_54 = 0;
            sVar6 = std::
                    vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>::
                    size(this), (ulong)(long)local_54 < sVar6; local_54 = local_54 + 1) {
          pvVar7 = std::
                   vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>::
                   operator[](this,(long)local_54);
          if ((pvVar7->diagSilenced & 1U) == 0) {
            std::__cxx11::string::clear();
            SQCompilationContext::renderDiagnosticHeader(DI_GLOBAL_NAME_REDEF,&local_30,uVar8);
            lVar2 = local_8;
            pcVar1 = local_10;
            uVar4 = std::__cxx11::string::c_str();
            in_stack_fffffffffffffed8 =
                 (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1e6991;
            (*pcVar1)(lVar2,1,uVar4,pvVar7->filename,(long)pvVar7->line,(long)pvVar7->column);
          }
        }
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>
      ::operator++(in_stack_fffffffffffffee0);
    }
    local_78[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
                  *)in_stack_fffffffffffffed8);
    while( true ) {
      local_80._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
                  *)in_stack_fffffffffffffed8);
      bVar3 = std::operator!=(local_78,&local_80);
      if (!bVar3) break;
      local_88 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>
                               *)0x1994b3);
      local_98._M_cur =
           (__node_type *)
           std::
           unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(in_stack_fffffffffffffed8,(key_type *)0x1994cf);
      local_a0._M_cur =
           (__node_type *)
           std::
           unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(in_stack_fffffffffffffed8);
      local_89 = std::__detail::operator!=(&local_98,&local_a0);
      if (!(bool)local_89) {
        local_a8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
                     *)in_stack_fffffffffffffed8,(key_type *)0x199538);
        local_b0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>_>
                    *)in_stack_fffffffffffffed8);
        bVar3 = std::operator!=(&local_a8,&local_b0);
        if (!bVar3) {
          ppVar5 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>
                                 *)0x199587);
          for (local_bc = 0;
              sVar6 = std::
                      vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>
                      ::size(&ppVar5->second), (ulong)(long)local_bc < sVar6;
              local_bc = local_bc + 1) {
            pvVar7 = std::
                     vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>::
                     operator[](&ppVar5->second,(long)local_bc);
            if ((pvVar7->diagSilenced & 1U) == 0) {
              std::__cxx11::string::clear();
              uVar8 = std::__cxx11::string::c_str();
              SQCompilationContext::renderDiagnosticHeader(DI_UNDEFINED_GLOBAL,&local_30,uVar8);
              lVar2 = local_8;
              pcVar1 = local_10;
              uVar8 = std::__cxx11::string::c_str();
              in_stack_fffffffffffffed8 =
                   (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x1e6991;
              (*pcVar1)(lVar2,1,uVar8,pvVar7->filename,(long)pvVar7->line,(long)pvVar7->column);
            }
          }
        }
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<SQCompilation::IdLocation,_std::allocator<SQCompilation::IdLocation>_>_>_>
      ::operator++(in_stack_fffffffffffffee0);
    }
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void StaticAnalyzer::reportGlobalNamesWarnings(HSQUIRRELVM vm) {
  auto errorFunc = _ss(vm)->_compilererrorhandler;

  if (!errorFunc)
    return;

  // 1. Check multiple declarations

  std::string message;

  for (auto it = declaredGlobals.begin(); it != declaredGlobals.end(); ++it) {
    const SQChar *name = it->first.c_str();
    const auto &declarations = it->second;

    if (declarations.size() == 1)
      continue;

    for (int32_t i = 0; i < declarations.size(); ++i) {
      const IdLocation &loc = declarations[i];
      if (loc.diagSilenced)
        continue;

      message.clear();
      SQCompilationContext::renderDiagnosticHeader(DiagnosticsId::DI_GLOBAL_NAME_REDEF, &message, name);
      errorFunc(vm, SEV_WARNING, message.c_str(), loc.filename, loc.line, loc.column, "\n");
    }
  }

  // 2. Check undefined usages

  for (auto it = usedGlobals.begin(); it != usedGlobals.end(); ++it) {
    const std::string &id = it->first;

    bool isKnownBinding = knownBindings.find(id) != knownBindings.end();
    if (isKnownBinding)
      continue;

    if (declaredGlobals.find(id) != declaredGlobals.end())
      continue;

    const auto &usages = it->second;

    for (int32_t i = 0; i < usages.size(); ++i) {
      const IdLocation &loc = usages[i];
      if (loc.diagSilenced)
        continue;

      message.clear();
      SQCompilationContext::renderDiagnosticHeader(DiagnosticsId::DI_UNDEFINED_GLOBAL, &message, id.c_str());
      errorFunc(vm, SEV_WARNING, message.c_str(), loc.filename, loc.line, loc.column, "\n");
    }
  }
}